

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O3

Frame * rw::findUnattachedById(HAnimHierarchy *hier,Frame *f,int32 id)

{
  int iVar1;
  Frame *pFVar2;
  long lVar3;
  long lVar4;
  
  if (f != (Frame *)0x0) {
    lVar4 = (long)hAnimOffset;
    do {
      iVar1 = *(int *)(&(f->object).type + lVar4);
      if (iVar1 == id && -1 < iVar1) {
        if ((long)hier->numNodes < 1) {
          return f;
        }
        lVar3 = 0;
        while (*(Frame **)((long)&hier->nodeInfo->frame + lVar3) != f) {
          lVar3 = lVar3 + 0x18;
          if ((long)hier->numNodes * 0x18 == lVar3) {
            return f;
          }
        }
      }
      pFVar2 = findUnattachedById(hier,f->next,id);
      if (pFVar2 != (Frame *)0x0) {
        return pFVar2;
      }
      f = f->child;
    } while (f != (Frame *)0x0);
  }
  return (Frame *)0x0;
}

Assistant:

static Frame*
findUnattachedById(HAnimHierarchy *hier, Frame *f, int32 id)
{
	if(f == nil) return nil;
	HAnimData *hanim = HAnimData::get(f);
	if(hanim->id >= 0 && hanim->id == id && hier->getIndex(f) == -1) return f;
	Frame *ff = findUnattachedById(hier, f->next, id);
	if(ff) return ff;
	return findUnattachedById(hier, f->child, id);
}